

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O1

int Abc_NtkBddToSop(Abc_Ntk_t *pNtk,int fMode,int nCubeLimit)

{
  uint uVar1;
  uint uVar2;
  DdManager *unique;
  long *plVar3;
  int *pGuide;
  DdNode *bFuncOn;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Str_t *__ptr;
  char *pcVar7;
  DdNode **pFuncs;
  Mem_Flex_t *pMan;
  Vec_Str_t *vCube;
  char *pcVar8;
  Vec_Ptr_t *pVVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  char *__assertion;
  bool bVar14;
  int nCubes;
  long local_40;
  Abc_Ntk_t *local_38;
  
  unique = (DdManager *)pNtk->pManFunc;
  pVVar9 = pNtk->vObjs;
  uVar1 = pVVar9->nSize;
  __ptr = (Vec_Str_t *)malloc(0x10);
  uVar13 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar13 = uVar1;
  }
  __ptr->nSize = 0;
  __ptr->nCap = uVar13;
  if (uVar13 == 0) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = (char *)malloc((long)(int)uVar13 << 2);
  }
  local_40 = (long)(int)uVar1;
  __ptr->pArray = pcVar7;
  if ((int)uVar13 < (int)uVar1) {
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (char *)malloc(local_40 * 4);
    }
    else {
      pcVar7 = (char *)realloc(pcVar7,local_40 * 4);
    }
    __ptr->pArray = pcVar7;
    if (pcVar7 == (char *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    __ptr->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    pcVar7 = __ptr->pArray;
    uVar10 = 0;
    do {
      *(int *)(pcVar7 + uVar10 * 4) = fMode;
      uVar10 = uVar10 + 1;
    } while (uVar1 != uVar10);
  }
  __ptr->nSize = uVar1;
  if (nCubeLimit < 1000000000) {
    iVar5 = pVVar9->nSize;
    iVar4 = 8;
    if (6 < iVar5 - 1U) {
      iVar4 = iVar5;
    }
    if (iVar4 == 0) {
      pFuncs = (DdNode **)0x0;
    }
    else {
      pFuncs = (DdNode **)malloc((long)iVar4 << 3);
    }
    memset(pFuncs,0,(long)iVar5 * 8);
    iVar4 = Cudd_ReorderingStatus(unique,(Cudd_ReorderingType *)&nCubes);
    if (iVar4 != 0) {
      __assert_fail("!Cudd_ReorderingStatus(dd, (Cudd_ReorderingType *)&nCubes)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                    ,0x178,"int Abc_NtkBddToSop(Abc_Ntk_t *, int, int)");
    }
    pVVar9 = pNtk->vObjs;
    lVar11 = (long)pVVar9->nSize;
    if (0 < lVar11) {
      lVar12 = 0;
      do {
        plVar3 = (long *)pVVar9->pArray[lVar12];
        if (((plVar3 != (long *)0x0) &&
            (bVar14 = (*(uint *)((long)plVar3 + 0x14) & 0xf) != 7, !bVar14)) &&
           ((bVar14 ||
            (((*(int *)(*plVar3 + 4) != 4 || (*(int *)((long)plVar3 + 0x1c) != 1)) ||
             (plVar3[7] != 0)))))) {
          if (iVar5 <= lVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          pFuncs[lVar12] = (DdNode *)plVar3[7];
        }
        lVar12 = lVar12 + 1;
      } while (lVar11 != lVar12);
    }
    pGuide = (int *)__ptr->pArray;
    iVar5 = Extra_bddCountCubes(unique,pFuncs,iVar5,fMode,nCubeLimit,pGuide);
    nCubes = iVar5;
    if (pFuncs != (DdNode **)0x0) {
      free(pFuncs);
    }
    if (iVar5 == -1) {
      vCube = __ptr;
      if (pGuide != (int *)0x0) {
        free(pGuide);
        __ptr->pArray = (char *)0x0;
      }
LAB_00844782:
      free(vCube);
      return 0;
    }
  }
  if (pNtk->ntkFunc != ABC_FUNC_BDD) {
    __assert_fail("Abc_NtkHasBdd(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x187,"int Abc_NtkBddToSop(Abc_Ntk_t *, int, int)");
  }
  if (0 < unique->size) {
    Cudd_zddVarsFromBddVars(unique,2);
  }
  pMan = Mem_FlexStart();
  vCube = (Vec_Str_t *)malloc(0x10);
  vCube->nCap = 100;
  vCube->nSize = 0;
  pcVar7 = (char *)malloc(100);
  vCube->pArray = pcVar7;
  pVVar9 = pNtk->vObjs;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    local_38 = pNtk;
    do {
      plVar3 = (long *)pVVar9->pArray[lVar11];
      if (((plVar3 != (long *)0x0) &&
          (bVar14 = (*(uint *)((long)plVar3 + 0x14) & 0xf) != 7, !bVar14)) &&
         (((bVar14 || ((*(int *)(*plVar3 + 4) != 4 || (*(int *)((long)plVar3 + 0x1c) != 1)))) ||
          (plVar3[7] != 0)))) {
        bFuncOn = (DdNode *)plVar3[7];
        if (bFuncOn == (DdNode *)0x0) {
          __assert_fail("pNode->pData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                        ,0x193,"int Abc_NtkBddToSop(Abc_Ntk_t *, int, int)");
        }
        if (local_40 <= lVar11) {
          __assertion = "i >= 0 && i < p->nSize";
          pcVar8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
          ;
          pcVar7 = "int Vec_IntEntry(Vec_Int_t *, int)";
LAB_008447e3:
          __assert_fail(__assertion,pcVar8,0x1a9,pcVar7);
        }
        pcVar7 = __ptr->pArray;
        pcVar8 = Abc_ConvertBddToSop(pMan,unique,bFuncOn,bFuncOn,*(int *)((long)plVar3 + 0x1c),0,
                                     vCube,*(int *)(pcVar7 + lVar11 * 4));
        plVar3[1] = (long)pcVar8;
        if (pcVar8 == (char *)0x0) {
          Mem_FlexStop(pMan,0);
          Abc_NtkCleanNext(pNtk);
          if (pcVar7 != (char *)0x0) {
            free(pcVar7);
            __ptr->pArray = (char *)0x0;
          }
          free(__ptr);
          if (vCube->pArray != (char *)0x0) {
            free(vCube->pArray);
            vCube->pArray = (char *)0x0;
          }
          goto LAB_00844782;
        }
        iVar5 = Abc_SopGetVarNum(pcVar8);
        if (iVar5 == 0) {
          *(undefined4 *)((long)plVar3 + 0x1c) = 0;
        }
        iVar5 = *(int *)((long)plVar3 + 0x1c);
        iVar4 = Abc_SopGetVarNum((char *)plVar3[1]);
        if (iVar5 != iVar4) {
          uVar1 = *(uint *)(plVar3 + 2);
          uVar13 = *(uint *)((long)plVar3 + 0x14);
          uVar2 = *(uint *)((long)plVar3 + 0x1c);
          uVar6 = Abc_SopGetVarNum((char *)plVar3[1]);
          pNtk = local_38;
          printf("Node %d with level %d has %d fanins but its SOP has support size %d.\n",
                 (ulong)uVar1,(ulong)(uVar13 >> 0xc),(ulong)uVar2,(ulong)uVar6);
          fflush(_stdout);
        }
        iVar5 = *(int *)((long)plVar3 + 0x1c);
        iVar4 = Abc_SopGetVarNum((char *)plVar3[1]);
        if (iVar5 != iVar4) {
          __assertion = "Abc_ObjFaninNum(pNode) == Abc_SopGetVarNum((char *)pNode->pNext)";
          pcVar8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
          ;
          pcVar7 = "int Abc_NtkBddToSop(Abc_Ntk_t *, int, int)";
          goto LAB_008447e3;
        }
      }
      lVar11 = lVar11 + 1;
      pVVar9 = pNtk->vObjs;
    } while (lVar11 < pVVar9->nSize);
  }
  if (__ptr->pArray != (char *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (char *)0x0;
  }
  free(__ptr);
  if (vCube->pArray != (char *)0x0) {
    free(vCube->pArray);
    vCube->pArray = (char *)0x0;
  }
  free(vCube);
  pNtk->ntkFunc = ABC_FUNC_SOP;
  pNtk->pManFunc = pMan;
  pVVar9 = pNtk->vObjs;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      plVar3 = (long *)pVVar9->pArray[lVar11];
      if (((plVar3 != (long *)0x0) &&
          (bVar14 = (*(uint *)((long)plVar3 + 0x14) & 0xf) != 7, !bVar14)) &&
         ((bVar14 ||
          (((*(int *)(*plVar3 + 4) != 4 || (*(int *)((long)plVar3 + 0x1c) != 1)) || (plVar3[7] != 0)
           ))))) {
        Cudd_RecursiveDeref(unique,(DdNode *)plVar3[7]);
        plVar3[7] = plVar3[1];
        plVar3[1] = 0;
      }
      lVar11 = lVar11 + 1;
      pVVar9 = pNtk->vObjs;
    } while (lVar11 < pVVar9->nSize);
  }
  Extra_StopManager(unique);
  Abc_NtkSortSops(pNtk);
  return 1;
}

Assistant:

int Abc_NtkBddToSop( Abc_Ntk_t * pNtk, int fMode, int nCubeLimit )
{
    Vec_Int_t * vGuide;
    Vec_Str_t * vCube;
    Abc_Obj_t * pNode;
    Mem_Flex_t * pManNew;
    DdManager * dd = (DdManager *)pNtk->pManFunc;
    DdNode * bFunc;
    int i, nCubes;

    // compute SOP size
    vGuide = Vec_IntAlloc( Abc_NtkObjNumMax(pNtk) );
    Vec_IntFill( vGuide, Abc_NtkObjNumMax(pNtk), fMode );
    if ( nCubeLimit < ABC_INFINITY )
    {
        // collect all BDDs into one array
        Vec_Ptr_t * vFuncs = Vec_PtrStart( Abc_NtkObjNumMax(pNtk) );
        assert( !Cudd_ReorderingStatus(dd, (Cudd_ReorderingType *)&nCubes) );
        Abc_NtkForEachNode( pNtk, pNode, i )
            if ( !Abc_ObjIsBarBuf(pNode) )
                Vec_PtrWriteEntry( vFuncs, i, pNode->pData );
        // compute the number of cubes in the ISOPs and detemine polarity
        nCubes = Extra_bddCountCubes( dd, (DdNode **)Vec_PtrArray(vFuncs), Vec_PtrSize(vFuncs), fMode, nCubeLimit, Vec_IntArray(vGuide) );
        Vec_PtrFree( vFuncs );
        if ( nCubes == -1 )
        {
            Vec_IntFree( vGuide );
            return 0;
        }
        //printf( "The total number of cubes = %d.\n", nCubes );
    }

    assert( Abc_NtkHasBdd(pNtk) );
    if ( dd->size > 0 )
    Cudd_zddVarsFromBddVars( dd, 2 );
    // create the new manager
    pManNew = Mem_FlexStart();

    // go through the objects
    vCube = Vec_StrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjIsBarBuf(pNode) )
            continue;
        assert( pNode->pData );
        bFunc = (DdNode *)pNode->pData;
        pNode->pNext = (Abc_Obj_t *)Abc_ConvertBddToSop( pManNew, dd, bFunc, bFunc, Abc_ObjFaninNum(pNode), 0, vCube, Vec_IntEntry(vGuide, i) );
        if ( pNode->pNext == NULL )
        {
            Mem_FlexStop( pManNew, 0 );
            Abc_NtkCleanNext( pNtk );
//            printf( "Converting from BDDs to SOPs has failed.\n" );
            Vec_IntFree( vGuide );
            Vec_StrFree( vCube );
            return 0;
        }
        // it may happen that a constant node was created after structural mapping
        if ( Abc_SopGetVarNum((char *)pNode->pNext) == 0 )
            pNode->vFanins.nSize = 0;
        // check the support
        if ( Abc_ObjFaninNum(pNode) != Abc_SopGetVarNum((char *)pNode->pNext) )
        {
            printf( "Node %d with level %d has %d fanins but its SOP has support size %d.\n", 
                pNode->Id, pNode->Level, Abc_ObjFaninNum(pNode), Abc_SopGetVarNum((char *)pNode->pNext) );
            fflush( stdout );
        }
        assert( Abc_ObjFaninNum(pNode) == Abc_SopGetVarNum((char *)pNode->pNext) );
    }
    Vec_IntFree( vGuide );
    Vec_StrFree( vCube );

    // update the network type
    pNtk->ntkFunc = ABC_FUNC_SOP;
    // set the new manager
    pNtk->pManFunc = pManNew;
    // transfer from next to data
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjIsBarBuf(pNode) )
            continue;
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pData );
        pNode->pData = pNode->pNext;
        pNode->pNext = NULL;
    }

    // check for remaining references in the package
    Extra_StopManager( dd );

    // reorder fanins and cubes to make SOPs more human-readable
    Abc_NtkSortSops( pNtk );
    return 1;
}